

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmtable.cpp
# Opt level: O1

void __thiscall icu_63::Formattable::Formattable(Formattable *this,UObject *objectToAdopt)

{
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__Formattable_003d6938;
  (this->fBogus).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003e7ab8;
  (this->fBogus).fUnion.fStackFields.fLengthAndFlags = 2;
  (this->fValue).fObject = (UObject *)0x0;
  this->fType = kLong;
  this->fDecimalStr = (CharString *)0x0;
  this->fDecimalQuantity = (DecimalQuantity *)0x0;
  UnicodeString::setToBogus(&this->fBogus);
  this->fType = kObject;
  (this->fValue).fObject = objectToAdopt;
  return;
}

Assistant:

Formattable::Formattable(UObject* objectToAdopt)
{
    init();
    fType = kObject;
    fValue.fObject = objectToAdopt;
}